

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstrumentMemory.cpp
# Opt level: O1

void __thiscall wasm::InstrumentMemory::visitArraySet(InstrumentMemory *this,ArraySet *curr)

{
  Index IVar1;
  uintptr_t uVar2;
  undefined8 uVar3;
  uintptr_t uVar4;
  Expression *pEVar5;
  MixedArena *pMVar6;
  initializer_list<wasm::Expression_*> __l;
  initializer_list<wasm::Expression_*> __l_00;
  Const *local_70;
  Expression *local_68;
  Builder local_60;
  Builder builder;
  pointer local_48;
  allocator_type local_31;
  
  uVar2 = _ZN4wasmL15array_set_indexE_1;
  uVar3 = _ZN4wasmL15array_set_indexE_0;
  local_60.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>_>
       ).super_PostWalker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.
       super_Walker<wasm::InstrumentMemory,_wasm::Visitor<wasm::InstrumentMemory,_void>_>.currModule
  ;
  IVar1 = this->id;
  this->id = IVar1 + 1;
  local_70 = Builder::makeConst<int>(&local_60,IVar1);
  local_68 = curr->index;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_70;
  std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
            ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,__l,
             &local_31);
  pMVar6 = &(local_60.wasm)->allocator;
  pEVar5 = (Expression *)MixedArena::allocSpace(pMVar6,0x48,8);
  pEVar5->_id = CallId;
  (pEVar5->type).id = 0;
  *(undefined8 *)(pEVar5 + 1) = 0;
  pEVar5[1].type.id = 0;
  *(undefined8 *)(pEVar5 + 2) = 0;
  pEVar5[2].type.id = (uintptr_t)pMVar6;
  *(undefined8 *)(pEVar5 + 3) = 0;
  pEVar5[3].type.id = 0;
  *(undefined1 *)&pEVar5[4]._id = InvalidId;
  (pEVar5->type).id = 2;
  *(undefined8 *)(pEVar5 + 3) = uVar3;
  pEVar5[3].type.id = uVar2;
  ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
  set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
            ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar5 + 1),
             (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
  *(undefined1 *)&pEVar5[4]._id = InvalidId;
  curr->index = pEVar5;
  if (builder.wasm != (Module *)0x0) {
    operator_delete(builder.wasm,(long)local_48 - (long)builder.wasm);
  }
  uVar2 = (curr->value->type).id;
  if (uVar2 - 2 < 4) {
    uVar3 = *(undefined8 *)(&PTR_DAT_00d890f0)[uVar2];
    uVar2 = *(uintptr_t *)(&PTR_array_get_val_f32_00d890d0)[uVar2];
    IVar1 = this->id;
    this->id = IVar1 + 1;
    local_70 = Builder::makeConst<int>(&local_60,IVar1);
    local_68 = curr->value;
    __l_00._M_len = 2;
    __l_00._M_array = (iterator)&local_70;
    std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
              ((vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder,__l_00,
               &local_31);
    uVar4 = (curr->value->type).id;
    pMVar6 = &(local_60.wasm)->allocator;
    pEVar5 = (Expression *)MixedArena::allocSpace(pMVar6,0x48,8);
    pEVar5->_id = CallId;
    (pEVar5->type).id = 0;
    *(undefined8 *)(pEVar5 + 1) = 0;
    pEVar5[1].type.id = 0;
    *(undefined8 *)(pEVar5 + 2) = 0;
    pEVar5[2].type.id = (uintptr_t)pMVar6;
    *(undefined8 *)(pEVar5 + 3) = 0;
    pEVar5[3].type.id = 0;
    *(undefined1 *)&pEVar5[4]._id = InvalidId;
    (pEVar5->type).id = uVar4;
    *(undefined8 *)(pEVar5 + 3) = uVar3;
    pEVar5[3].type.id = uVar2;
    ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
    set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
              ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)(pEVar5 + 1),
               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)&builder);
    *(undefined1 *)&pEVar5[4]._id = InvalidId;
    curr->value = pEVar5;
    if (builder.wasm != (Module *)0x0) {
      operator_delete(builder.wasm,(long)local_48 - (long)builder.wasm);
    }
  }
  return;
}

Assistant:

void visitArraySet(ArraySet* curr) {
    Builder builder(*getModule());
    curr->index =
      builder.makeCall(array_set_index,
                       {builder.makeConst(int32_t(id++)), curr->index},
                       Type::i32);
    Name target;
    if (curr->value->type == Type::i32) {
      target = array_set_val_i32;
    } else if (curr->value->type == Type::i64) {
      target = array_set_val_i64;
    } else if (curr->value->type == Type::f32) {
      target = array_set_val_f32;
    } else if (curr->value->type == Type::f64) {
      target = array_set_val_f64;
    } else {
      return; // TODO: other types, unreachable, etc.
    }
    curr->value =
      builder.makeCall(target,
                       {builder.makeConst(int32_t(id++)), curr->value},
                       curr->value->type);
  }